

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O2

char * __thiscall ASDCP::UL::EncodeString(UL *this,char *str_buf,ui32_t buf_len)

{
  char *__format;
  
  if (buf_len < 0x27) {
    if (buf_len < 0x21) {
      return (char *)0x0;
    }
    __format = "%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x";
  }
  else {
    __format = "%02x%02x%02x%02x.%02x%02x%02x%02x.%02x%02x%02x%02x.%02x%02x%02x%02x";
  }
  snprintf(str_buf,buf_len,__format,(ulong)(this->super_Identifier<16U>).m_Value[0],
           (ulong)(this->super_Identifier<16U>).m_Value[1],
           (ulong)(this->super_Identifier<16U>).m_Value[2],
           (ulong)(this->super_Identifier<16U>).m_Value[3],
           (ulong)(this->super_Identifier<16U>).m_Value[4],
           (ulong)(this->super_Identifier<16U>).m_Value[5],
           (ulong)(this->super_Identifier<16U>).m_Value[6],
           (ulong)(this->super_Identifier<16U>).m_Value[7],
           (ulong)(this->super_Identifier<16U>).m_Value[8],
           (ulong)(this->super_Identifier<16U>).m_Value[9],
           (ulong)(this->super_Identifier<16U>).m_Value[10],
           (ulong)(this->super_Identifier<16U>).m_Value[0xb],
           (ulong)(this->super_Identifier<16U>).m_Value[0xc],
           (ulong)(this->super_Identifier<16U>).m_Value[0xd],
           (ulong)(this->super_Identifier<16U>).m_Value[0xe],
           (ulong)(this->super_Identifier<16U>).m_Value[0xf]);
  return str_buf;
}

Assistant:

const char*
ASDCP::UL::EncodeString(char* str_buf, ui32_t buf_len) const
{
  if ( buf_len > 38 ) // room for dotted notation?
    {
      snprintf(str_buf, buf_len,
	       "%02x%02x%02x%02x.%02x%02x%02x%02x.%02x%02x%02x%02x.%02x%02x%02x%02x",
	       m_Value[0],  m_Value[1],  m_Value[2],  m_Value[3],
	       m_Value[4],  m_Value[5],  m_Value[6],  m_Value[7],
	       m_Value[8],  m_Value[9],  m_Value[10], m_Value[11],
	       m_Value[12], m_Value[13], m_Value[14], m_Value[15]
               );

      return str_buf;
    }
  else if ( buf_len > 32 ) // room for compact?
    {
      snprintf(str_buf, buf_len,
	       "%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x",
	       m_Value[0],  m_Value[1],  m_Value[2],  m_Value[3],
	       m_Value[4],  m_Value[5],  m_Value[6],  m_Value[7],
	       m_Value[8],  m_Value[9],  m_Value[10], m_Value[11],
	       m_Value[12], m_Value[13], m_Value[14], m_Value[15]
               );

      return str_buf;
    }

  return 0;
}